

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O2

int4 __thiscall EmitXml::beginFunction(EmitXml *this,Funcdata *fd)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->s,"<function ");
  std::operator<<(poVar1,highlight[8]);
  std::operator<<(this->s,'>');
  return 0;
}

Assistant:

int4 EmitXml::beginFunction(const Funcdata *fd) {
  *s << "<function " << highlight[(int4)no_color];
  *s << '>';
  return 0;
}